

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O2

packet_t * new_tcp_pkt(char *src_ip,char *dst_ip,uint16_t src_port,uint16_t dst_port,uint8_t flag)

{
  tcp_t *ptVar1;
  packet_t *pkt;
  double __x;
  double extraout_XMM0_Qa;
  double __x_00;
  
  pkt = parse_pkt(default_tcp,0x36);
  if (pkt == (packet_t *)0x0) {
    _log(__x);
  }
  else {
    __x_00 = __x;
    if ((pkt->eth_type == 0x800) && (pkt->ip != (ip_t *)0x0)) {
      inet_pton(2,src_ip,&pkt->ip->src);
      inet_pton(2,dst_ip,&pkt->ip->dst);
      __x_00 = extraout_XMM0_Qa;
      if ((pkt->ip_proto == '\x06') && (ptVar1 = pkt->tcp, ptVar1 != (tcp_t *)0x0)) {
        ptVar1->src = src_port << 8 | src_port >> 8;
        ptVar1->dst = dst_port << 8 | dst_port >> 8;
        ptVar1->flag = flag;
        return pkt;
      }
    }
    _log(__x_00);
    free_pkt(pkt);
  }
  return (packet_t *)0x0;
}

Assistant:

packet_t *new_tcp_pkt(const char *src_ip, const char *dst_ip, uint16_t src_port, uint16_t dst_port, uint8_t flag)
{
	packet_t *pkt = parse_pkt(default_tcp, sizeof(default_tcp));

	if (pkt == NULL) {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		return NULL;
	}

	if (pkt->eth_type == ETH_IP && pkt->ip) {
		inet_pton(AF_INET, src_ip, (struct in_addr *)&pkt->ip->src);
		inet_pton(AF_INET, dst_ip, (struct in_addr *)&pkt->ip->dst);
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	if (pkt->ip_proto == IPPROTO_TCP && pkt->tcp) {
		pkt->tcp->src = htons(src_port);
		pkt->tcp->dst = htons(dst_port);
		pkt->tcp->flag = flag;
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	return pkt;
}